

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::postprocess_dirty_nodes(Simulator *this)

{
  pointer pNVar1;
  uint uVar2;
  uint *puVar3;
  pointer pNVar4;
  size_t sVar5;
  pointer pVVar6;
  pointer puVar7;
  undefined8 in_RAX;
  Value VVar8;
  uint *puVar9;
  undefined4 uStack_38;
  uint node_id;
  
  puVar9 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  _uStack_38 = in_RAX;
  do {
    if (puVar9 == puVar3) {
      puVar7 = (this->m_dirty_nodes_write).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_dirty_nodes_write).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar7) {
        (this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar7;
      }
      return;
    }
    uVar2 = *puVar9;
    _uStack_38 = CONCAT44(uVar2,uStack_38);
    pNVar4 = (this->m_node_metadata).
             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar1 = pNVar4 + uVar2;
    sVar5 = *(size_t *)((long)&pNVar4[uVar2].m_active_pins._M_t._M_impl + 0x28);
    if (sVar5 == 1) {
      VVar8 = (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(*(_Base_ptr *)((long)&(pNVar1->m_active_pins)._M_t._M_impl + 0x18))[1]._M_color];
      (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2] = VVar8;
LAB_00113587:
      (this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2] = this->m_time;
    }
    else {
      if (sVar5 == 0) {
        VVar8 = pNVar1->m_default;
        (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar2] = VVar8;
        goto LAB_00113587;
      }
      (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2] = VALUE_ERROR;
      VVar8 = VALUE_ERROR;
    }
    pVVar6 = (this->m_node_values_read).
             super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pVVar6[uVar2] != VVar8) {
      (this->m_node_change_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2] = this->m_time;
      pVVar6[uVar2] = VVar8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_dirty_nodes_read,&node_id);
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void Simulator::postprocess_dirty_nodes() {

    for (auto node_id : m_dirty_nodes_write) {

        switch (m_node_metadata[node_id].m_active_pins.size()) {
            case 0 :        // no active writers: use default value (i.e. pull-up/down resistor)
                m_node_values_write[node_id] = m_node_metadata[node_id].m_default;
                m_node_write_time[node_id] = m_time;
                break;
            case 1 : {      // normal case - 1 active writer
                pin_t pin = *m_node_metadata[node_id].m_active_pins.begin();
                m_node_values_write[node_id] = m_pin_values[pin];
                m_node_write_time[node_id] = m_time;
                break;
            }
            default :       // multiple active writers
               m_node_values_write[node_id] = VALUE_ERROR;
               break;
        }

        if (m_node_values_read[node_id] != m_node_values_write[node_id]) {
            m_node_change_time[node_id] = m_time;
            m_node_values_read[node_id] = m_node_values_write[node_id];
            m_dirty_nodes_read.push_back(node_id);
        }
    }

    m_dirty_nodes_write.clear();
}